

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O2

HelicsTime helicsInputLastUpdateTime(HelicsInput inp)

{
  Time TVar1;
  HelicsTime HVar2;
  
  if ((inp == (HelicsInput)0x0) || (*inp != 0x3456e052)) {
    HVar2 = -1.785e+39;
  }
  else {
    TVar1 = helics::Input::getLastUpdate(*(Input **)((long)inp + 0x18));
    HVar2 = (double)(TVar1.internalTimeCode % 1000000000) * 1e-09 +
            (double)(TVar1.internalTimeCode / 1000000000);
  }
  return HVar2;
}

Assistant:

HelicsTime helicsInputLastUpdateTime(HelicsInput inp)
{
    auto* inpObj = verifyInput(inp, nullptr);
    if (inpObj == nullptr) {
        return HELICS_TIME_INVALID;
    }
    try {
        auto time = inpObj->inputPtr->getLastUpdate();
        return static_cast<HelicsTime>(time);
    }
    // LCOV_EXCL_START
    catch (...) {
        return HELICS_TIME_INVALID;
    }
    // LCOV_EXCL_STOP
}